

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred.c
# Opt level: O3

void ipred_hor_uv(pel *src,pel *dst,int i_dst,int w,int h)

{
  undefined2 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int iVar16;
  long lVar17;
  undefined1 auVar18 [16];
  int iVar19;
  undefined1 in_XMM1 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  int iVar25;
  undefined1 auVar24 [16];
  undefined1 auVar26 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  int iVar37;
  int iVar38;
  int iVar41;
  undefined1 auVar39 [16];
  int iVar42;
  undefined1 auVar40 [16];
  undefined1 in_XMM15 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  long lVar27;
  
  auVar15 = _DAT_00163a40;
  auVar14 = _DAT_00163a30;
  auVar13 = _DAT_00163a20;
  auVar12 = _DAT_00163a10;
  if (0 < h) {
    lVar17 = (ulong)(uint)w - 1;
    auVar18._8_4_ = (int)lVar17;
    auVar18._0_8_ = lVar17;
    auVar18._12_4_ = (int)((ulong)lVar17 >> 0x20);
    iVar16 = 0;
    auVar18 = auVar18 ^ _DAT_00163a40;
    do {
      if (0 < w) {
        uVar1 = *(undefined2 *)src;
        lVar17 = 0;
        auVar26 = auVar14;
        auVar28 = auVar13;
        auVar29 = auVar12;
        auVar30 = _DAT_00163a00;
        do {
          auVar31 = auVar26 ^ auVar15;
          iVar38 = auVar18._0_4_;
          iVar37 = -(uint)(iVar38 < auVar31._0_4_);
          iVar25 = auVar18._4_4_;
          auVar32._4_4_ = -(uint)(iVar25 < auVar31._4_4_);
          iVar42 = auVar18._8_4_;
          iVar41 = -(uint)(iVar42 < auVar31._8_4_);
          iVar19 = auVar18._12_4_;
          auVar32._12_4_ = -(uint)(iVar19 < auVar31._12_4_);
          auVar20._4_4_ = iVar37;
          auVar20._0_4_ = iVar37;
          auVar20._8_4_ = iVar41;
          auVar20._12_4_ = iVar41;
          auVar43 = pshuflw(in_XMM15,auVar20,0xe8);
          auVar21._4_4_ = -(uint)(auVar31._4_4_ == iVar25);
          auVar21._12_4_ = -(uint)(auVar31._12_4_ == iVar19);
          auVar21._0_4_ = auVar21._4_4_;
          auVar21._8_4_ = auVar21._12_4_;
          auVar20 = pshuflw(in_XMM1,auVar21,0xe8);
          auVar32._0_4_ = auVar32._4_4_;
          auVar32._8_4_ = auVar32._12_4_;
          auVar44 = pshuflw(auVar43,auVar32,0xe8);
          auVar31._8_4_ = 0xffffffff;
          auVar31._0_8_ = 0xffffffffffffffff;
          auVar31._12_4_ = 0xffffffff;
          auVar31 = (auVar44 | auVar20 & auVar43) ^ auVar31;
          auVar31 = packssdw(auVar31,auVar31);
          if ((auVar31 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(undefined2 *)(dst + lVar17) = uVar1;
          }
          auVar44._4_4_ = iVar37;
          auVar44._0_4_ = iVar37;
          auVar44._8_4_ = iVar41;
          auVar44._12_4_ = iVar41;
          auVar32 = auVar21 & auVar44 | auVar32;
          auVar20 = packssdw(auVar32,auVar32);
          auVar43._8_4_ = 0xffffffff;
          auVar43._0_8_ = 0xffffffffffffffff;
          auVar43._12_4_ = 0xffffffff;
          auVar20 = packssdw(auVar20 ^ auVar43,auVar20 ^ auVar43);
          if ((auVar20._0_4_ >> 0x10 & 1) != 0) {
            *(undefined2 *)(dst + lVar17 + 2) = uVar1;
          }
          auVar20 = auVar28 ^ auVar15;
          iVar37 = -(uint)(iVar38 < auVar20._0_4_);
          auVar39._4_4_ = -(uint)(iVar25 < auVar20._4_4_);
          iVar41 = -(uint)(iVar42 < auVar20._8_4_);
          auVar39._12_4_ = -(uint)(iVar19 < auVar20._12_4_);
          auVar33._4_4_ = iVar37;
          auVar33._0_4_ = iVar37;
          auVar33._8_4_ = iVar41;
          auVar33._12_4_ = iVar41;
          iVar37 = -(uint)(auVar20._4_4_ == iVar25);
          iVar41 = -(uint)(auVar20._12_4_ == iVar19);
          auVar6._4_4_ = iVar37;
          auVar6._0_4_ = iVar37;
          auVar6._8_4_ = iVar41;
          auVar6._12_4_ = iVar41;
          auVar39._0_4_ = auVar39._4_4_;
          auVar39._8_4_ = auVar39._12_4_;
          auVar20 = auVar6 & auVar33 | auVar39;
          auVar20 = packssdw(auVar20,auVar20);
          auVar2._8_4_ = 0xffffffff;
          auVar2._0_8_ = 0xffffffffffffffff;
          auVar2._12_4_ = 0xffffffff;
          auVar20 = packssdw(auVar20 ^ auVar2,auVar20 ^ auVar2);
          if ((auVar20 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            *(undefined2 *)(dst + lVar17 + 4) = uVar1;
          }
          auVar20 = pshufhw(auVar20,auVar33,0x84);
          auVar7._4_4_ = iVar37;
          auVar7._0_4_ = iVar37;
          auVar7._8_4_ = iVar41;
          auVar7._12_4_ = iVar41;
          auVar32 = pshufhw(auVar33,auVar7,0x84);
          auVar21 = pshufhw(auVar20,auVar39,0x84);
          auVar22._8_4_ = 0xffffffff;
          auVar22._0_8_ = 0xffffffffffffffff;
          auVar22._12_4_ = 0xffffffff;
          auVar22 = (auVar21 | auVar32 & auVar20) ^ auVar22;
          auVar20 = packssdw(auVar22,auVar22);
          if ((auVar20 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(undefined2 *)(dst + lVar17 + 6) = uVar1;
          }
          auVar20 = auVar29 ^ auVar15;
          iVar37 = -(uint)(iVar38 < auVar20._0_4_);
          auVar35._4_4_ = -(uint)(iVar25 < auVar20._4_4_);
          iVar41 = -(uint)(iVar42 < auVar20._8_4_);
          auVar35._12_4_ = -(uint)(iVar19 < auVar20._12_4_);
          auVar8._4_4_ = iVar37;
          auVar8._0_4_ = iVar37;
          auVar8._8_4_ = iVar41;
          auVar8._12_4_ = iVar41;
          auVar21 = pshuflw(auVar31,auVar8,0xe8);
          auVar23._0_4_ = -(uint)(auVar20._0_4_ == iVar38);
          auVar23._4_4_ = -(uint)(auVar20._4_4_ == iVar25);
          auVar23._8_4_ = -(uint)(auVar20._8_4_ == iVar42);
          auVar23._12_4_ = -(uint)(auVar20._12_4_ == iVar19);
          auVar34._4_4_ = auVar23._4_4_;
          auVar34._0_4_ = auVar23._4_4_;
          auVar34._8_4_ = auVar23._12_4_;
          auVar34._12_4_ = auVar23._12_4_;
          auVar31 = pshuflw(auVar23,auVar34,0xe8);
          auVar35._0_4_ = auVar35._4_4_;
          auVar35._8_4_ = auVar35._12_4_;
          auVar20 = pshuflw(auVar21,auVar35,0xe8);
          auVar3._8_4_ = 0xffffffff;
          auVar3._0_8_ = 0xffffffffffffffff;
          auVar3._12_4_ = 0xffffffff;
          in_XMM15 = (auVar20 | auVar31 & auVar21) ^ auVar3;
          auVar31 = packssdw(auVar31 & auVar21,in_XMM15);
          if ((auVar31 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(undefined2 *)(dst + lVar17 + 8) = uVar1;
          }
          auVar9._4_4_ = iVar37;
          auVar9._0_4_ = iVar37;
          auVar9._8_4_ = iVar41;
          auVar9._12_4_ = iVar41;
          auVar35 = auVar34 & auVar9 | auVar35;
          auVar20 = packssdw(auVar35,auVar35);
          auVar4._8_4_ = 0xffffffff;
          auVar4._0_8_ = 0xffffffffffffffff;
          auVar4._12_4_ = 0xffffffff;
          auVar31 = packssdw(auVar31,auVar20 ^ auVar4);
          if ((auVar31 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            *(undefined2 *)(dst + lVar17 + 10) = uVar1;
          }
          auVar31 = auVar30 ^ auVar15;
          iVar38 = -(uint)(iVar38 < auVar31._0_4_);
          auVar40._4_4_ = -(uint)(iVar25 < auVar31._4_4_);
          iVar42 = -(uint)(iVar42 < auVar31._8_4_);
          auVar40._12_4_ = -(uint)(iVar19 < auVar31._12_4_);
          auVar36._4_4_ = iVar38;
          auVar36._0_4_ = iVar38;
          auVar36._8_4_ = iVar42;
          auVar36._12_4_ = iVar42;
          iVar38 = -(uint)(auVar31._4_4_ == iVar25);
          iVar25 = -(uint)(auVar31._12_4_ == iVar19);
          auVar10._4_4_ = iVar38;
          auVar10._0_4_ = iVar38;
          auVar10._8_4_ = iVar25;
          auVar10._12_4_ = iVar25;
          auVar40._0_4_ = auVar40._4_4_;
          auVar40._8_4_ = auVar40._12_4_;
          auVar31 = auVar10 & auVar36 | auVar40;
          auVar31 = packssdw(auVar31,auVar31);
          auVar5._8_4_ = 0xffffffff;
          auVar5._0_8_ = 0xffffffffffffffff;
          auVar5._12_4_ = 0xffffffff;
          auVar31 = packssdw(auVar31 ^ auVar5,auVar31 ^ auVar5);
          if ((auVar31 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            *(undefined2 *)(dst + lVar17 + 0xc) = uVar1;
          }
          auVar31 = pshufhw(auVar31,auVar36,0x84);
          auVar11._4_4_ = iVar38;
          auVar11._0_4_ = iVar38;
          auVar11._8_4_ = iVar25;
          auVar11._12_4_ = iVar25;
          auVar21 = pshufhw(auVar36,auVar11,0x84);
          auVar20 = pshufhw(auVar31,auVar40,0x84);
          auVar24._8_4_ = 0xffffffff;
          auVar24._0_8_ = 0xffffffffffffffff;
          auVar24._12_4_ = 0xffffffff;
          auVar24 = (auVar20 | auVar21 & auVar31) ^ auVar24;
          in_XMM1 = packssdw(auVar24,auVar24);
          if ((in_XMM1 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(undefined2 *)(dst + lVar17 + 0xe) = uVar1;
          }
          lVar27 = auVar26._8_8_;
          auVar26._0_8_ = auVar26._0_8_ + 8;
          auVar26._8_8_ = lVar27 + 8;
          lVar27 = auVar28._8_8_;
          auVar28._0_8_ = auVar28._0_8_ + 8;
          auVar28._8_8_ = lVar27 + 8;
          lVar27 = auVar29._8_8_;
          auVar29._0_8_ = auVar29._0_8_ + 8;
          auVar29._8_8_ = lVar27 + 8;
          lVar27 = auVar30._8_8_;
          auVar30._0_8_ = auVar30._0_8_ + 8;
          auVar30._8_8_ = lVar27 + 8;
          lVar17 = lVar17 + 0x10;
        } while ((ulong)(w + 7U >> 3) << 4 != lVar17);
      }
      dst = dst + i_dst;
      src = src + -2;
      iVar16 = iVar16 + 1;
    } while (iVar16 != h);
  }
  return;
}

Assistant:

void ipred_hor_uv(pel *src, pel *dst, int i_dst, int w, int h)
{
    int i;
    int shift = sizeof(pel) * 8;
    
    for (i = 0; i < h; i++) {
        int uv_pixel = (src[1] << shift) + src[0];
        com_mset_2pel(dst, uv_pixel, w);
        dst += i_dst;
        src -= 2;
    }
}